

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O2

int GetAllValuesPololu(POLOLU *pPololu,int *selectedchannels,int *ais)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uchar sendbuf [512];
  uchar recvbuf [512];
  
  memset(sendbuf,0,0x200);
  iVar2 = 0;
  iVar4 = 0;
  for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 1) {
    if (selectedchannels[lVar5] != 0) {
      sendbuf[iVar2] = 0xaa;
      sendbuf[(long)iVar2 + 1] = (uchar)pPololu->DeviceNumber;
      sendbuf[(long)iVar2 + 2] = '\x10';
      sendbuf[(long)iVar2 + 3] = (uchar)lVar5;
      iVar4 = iVar4 + 1;
      iVar2 = iVar2 + 4;
    }
  }
  if (iVar4 == 0) {
    iVar2 = 0;
  }
  else {
    iVar3 = WriteAllRS232Port(&pPololu->RS232Port,sendbuf,iVar4 * 4);
    iVar2 = 1;
    if (iVar3 == 0) {
      if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
        fwrite(sendbuf,(long)(iVar4 * 4),1,(FILE *)pPololu->pfSaveFile);
        fflush((FILE *)pPololu->pfSaveFile);
      }
      mSleep(10);
      memset(recvbuf,0,0x200);
      iVar3 = ReadAllRS232Port(&pPololu->RS232Port,recvbuf,iVar4 * 2);
      if (iVar3 == 0) {
        if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
          fwrite(recvbuf,(long)(iVar4 * 2),1,(FILE *)pPololu->pfSaveFile);
          fflush((FILE *)pPololu->pfSaveFile);
        }
        ais[0x14] = 0;
        ais[0x15] = 0;
        ais[0x16] = 0;
        ais[0x17] = 0;
        ais[0x10] = 0;
        ais[0x11] = 0;
        ais[0x12] = 0;
        ais[0x13] = 0;
        ais[0xc] = 0;
        ais[0xd] = 0;
        ais[0xe] = 0;
        ais[0xf] = 0;
        ais[8] = 0;
        ais[9] = 0;
        ais[10] = 0;
        ais[0xb] = 0;
        ais[4] = 0;
        ais[5] = 0;
        ais[6] = 0;
        ais[7] = 0;
        ais[0] = 0;
        ais[1] = 0;
        ais[2] = 0;
        ais[3] = 0;
        iVar2 = 0;
        iVar4 = 0;
        for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 1) {
          if (selectedchannels[lVar5] != 0) {
            uVar1 = *(ushort *)(recvbuf + iVar4);
            ais[lVar5] = (uint)uVar1;
            pPololu->LastAIs[lVar5] = (uint)uVar1;
            iVar4 = iVar4 + 2;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

inline int GetAllValuesPololu(POLOLU* pPololu, int* selectedchannels, int* ais)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	unsigned char recvbuf[MAX_NB_BYTES_POLOLU];
	int sendbuflen = 0;
	int recvbuflen = 0;
	int channel = 0;
	int index = 0, nbselectedchannels = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));

	nbselectedchannels = 0;
	index = 0;

	for (channel = 0; channel < NB_CHANNELS_AI_POLOLU; channel++)
	{
		if (!selectedchannels[channel]) continue;

		sendbuf[index] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
		sendbuf[index+1] = (unsigned char)pPololu->DeviceNumber;
		sendbuf[index+2] = (unsigned char)(GET_POSITION_COMMAND_POLOLU & 0x7F);
		sendbuf[index+3] = (unsigned char)channel;	
		nbselectedchannels++;
		index += 4;
	}

	if (nbselectedchannels == 0) return EXIT_SUCCESS;

	sendbuflen = 4*nbselectedchannels;

	//printf("%s\n", sendbuf);

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	mSleep(10); // Added because sometimes there was a timeout on the read() 
	// (even though the data were available if read just after the timeout...)...

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 2*nbselectedchannels;

	if (ReadAllRS232Port(&pPololu->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}
	
	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);

	memset(ais, 0, NB_CHANNELS_AI_POLOLU*sizeof(int));
	index = 0;

	for (channel = 0; channel < NB_CHANNELS_AI_POLOLU; channel++)
	{
		if (!selectedchannels[channel]) continue;

		ais[channel] = recvbuf[index] + 256*recvbuf[index+1];

		// Update last known value.
		pPololu->LastAIs[channel] = ais[channel];
				
		index += 2;
	}

	return EXIT_SUCCESS;
}